

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O0

ZyanStatus
ZydisFormatterATTFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  uint uVar1;
  ZyanStatus ZVar2;
  ZydisDecodedOperand *pZVar3;
  bool bVar4;
  ZyanStatus status_047620348_15;
  ZyanStatus status_047620348_14;
  ZyanStatus status_047620348_13;
  ZyanBool decorate_operand;
  ZyanStatus status_047620348_12;
  ZyanStatus status_047620348_11;
  ZyanStatus status_047620348_10;
  ZyanStatus status_047620348_9;
  ZyanStatus status_047620348_8;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanUPointer buffer_state;
  ZydisDecodedOperand *operand;
  ZyanI8 i;
  void *pvStack_38;
  ZyanI8 c;
  ZyanUPointer state_mnemonic;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x2e,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x2f,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x30,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x31,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x32,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  formatter_local._4_4_ = (*formatter->func_print_prefixes)(formatter,buffer,context);
  if (((formatter_local._4_4_ & 0x80000000) != 0) ||
     (formatter_local._4_4_ = (*formatter->func_print_mnemonic)(formatter,buffer,context),
     (formatter_local._4_4_ & 0x80000000) != 0)) {
    return formatter_local._4_4_;
  }
  if (buffer->is_token_list == '\0') {
    pvStack_38 = (void *)(buffer->string).vector.size;
  }
  else {
    pvStack_38 = (buffer->string).vector.data;
  }
  operand._6_1_ = context->instruction->operand_count_visible;
LAB_0011b8a0:
  while( true ) {
    do {
      operand._6_1_ = operand._6_1_ + 0xff;
      if ((char)operand._6_1_ < '\0') {
        return 0x100000;
      }
      pZVar3 = context->operands + (char)operand._6_1_;
    } while (((operand._6_1_ == '\x01') && (pZVar3->type == ZYDIS_OPERAND_TYPE_REGISTER)) &&
            (pZVar3->encoding == ZYDIS_OPERAND_ENCODING_MASK));
    if (buffer->is_token_list == '\0') {
      _status_047620348_3 = (void *)(buffer->string).vector.size;
    }
    else {
      _status_047620348_3 = (buffer->string).vector.data;
    }
    if (_status_047620348_3 == pvStack_38) {
      if (buffer->is_token_list == '\0') {
        uVar1 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MNEMONIC);
      }
      else {
        uVar1 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MNEMONIC);
      }
    }
    else if (buffer->is_token_list == '\0') {
      uVar1 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_OPERAND);
    }
    else {
      uVar1 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_OPERAND);
    }
    if ((uVar1 & 0x80000000) != 0) {
      return uVar1;
    }
    context->operand = pZVar3;
    if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) break;
    ZVar2 = (*formatter->func_pre_operand)(formatter,buffer,context);
    if (ZVar2 != 0x20000b) {
      if ((ZVar2 & 0x80000000) != 0) {
        return ZVar2;
      }
      break;
    }
    ZVar2 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)_status_047620348_3);
    if ((ZVar2 & 0x80000000) != 0) {
      return ZVar2;
    }
  }
  switch(pZVar3->type) {
  case ZYDIS_OPERAND_TYPE_REGISTER:
    status_047620348_7 = (*formatter->func_format_operand_reg)(formatter,buffer,context);
    break;
  case ZYDIS_OPERAND_TYPE_MEMORY:
    status_047620348_7 = (*formatter->func_format_operand_mem)(formatter,buffer,context);
    break;
  case ZYDIS_OPERAND_TYPE_POINTER:
    status_047620348_7 = (*formatter->func_format_operand_ptr)(formatter,buffer,context);
    break;
  case ZYDIS_OPERAND_TYPE_IMMEDIATE:
    status_047620348_7 = (*formatter->func_format_operand_imm)(formatter,buffer,context);
    break;
  default:
    return 0x80100004;
  }
  if (status_047620348_7 == 0x20000b) {
    uVar1 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)_status_047620348_3);
  }
  else {
    if ((status_047620348_7 & 0x80000000) != 0) {
      return status_047620348_7;
    }
    if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
      ZVar2 = (*formatter->func_post_operand)(formatter,buffer,context);
      if (ZVar2 == 0x20000b) {
        uVar1 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)_status_047620348_3);
        goto joined_r0x0011bb5c;
      }
      if ((ZVar2 & 0x80000000) == 0) {
        return ZVar2;
      }
    }
    if ((context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) &&
       (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)) goto LAB_0011b8a0;
    if (((operand._6_1_ == '\0') &&
        ((1 < context->instruction->operand_count_visible &&
         (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK)))) &&
       (ZVar2 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_MASK),
       (ZVar2 & 0x80000000) != 0)) {
      return ZVar2;
    }
    if (pZVar3->type == ZYDIS_OPERAND_TYPE_MEMORY) {
      ZVar2 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_BC);
      if ((ZVar2 & 0x80000000) != 0) {
        return ZVar2;
      }
      if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) goto LAB_0011b8a0;
      ZVar2 = (*formatter->func_print_decorator)
                        (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
      if ((ZVar2 & 0x80000000) != 0) {
        return ZVar2;
      }
      uVar1 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_EH);
    }
    else {
      if ((int)(char)operand._6_1_ == context->instruction->operand_count_visible - 1) {
        bVar4 = pZVar3->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
      }
      else {
        bVar4 = false;
        if (((char)operand._6_1_ + 1 < (int)(uint)context->instruction->operand_count_visible) &&
           (bVar4 = true,
           context->operands[(char)operand._6_1_ + 1].type != ZYDIS_OPERAND_TYPE_IMMEDIATE)) {
          bVar4 = context->operands[(char)operand._6_1_ + 1].visibility ==
                  ZYDIS_OPERAND_VISIBILITY_HIDDEN;
        }
      }
      if (!bVar4) goto LAB_0011b8a0;
      if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
         (ZVar2 = (*formatter->func_print_decorator)
                            (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
         (ZVar2 & 0x80000000) != 0)) {
        return ZVar2;
      }
      ZVar2 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_RC);
      if ((ZVar2 & 0x80000000) != 0) {
        return ZVar2;
      }
      uVar1 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_SAE);
    }
  }
joined_r0x0011bb5c:
  if ((uVar1 & 0x80000000) != 0) {
    return uVar1;
  }
  goto LAB_0011b8a0;
}

Assistant:

ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);

    const ZyanI8 c = (ZyanI8)context->instruction->operand_count_visible - 1;
    for (ZyanI8 i = c; i >= 0; --i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) && 
                (context->instruction->operand_count_visible > 1) && 
                (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}